

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O1

bool WTF::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,off_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Word *pEVar1;
  bool bVar2;
  undefined8 uVar3;
  Elf64_Xword EVar4;
  Elf64_Addr EVar5;
  Elf64_Off EVar6;
  Elf64_Xword EVar7;
  undefined8 uVar8;
  Elf64_Xword EVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  size_t count;
  undefined8 *puVar14;
  undefined6 in_register_00000032;
  undefined8 *puVar15;
  int iVar16;
  Elf64_Shdr buf [16];
  undefined8 local_438;
  
  iVar12 = 0;
  do {
    iVar11 = iVar12;
    iVar16 = (int)CONCAT62(in_register_00000032,sh_num);
    if (iVar16 - iVar11 == 0 || iVar16 < iVar11) break;
    count = (long)(iVar16 - iVar11) << 6;
    if (0x3ff < count) {
      count = 0x400;
    }
    uVar10 = ReadFromOffset(fd,&local_438,count,(long)iVar11 * 0x40 + sh_offset);
    if (((uVar10 & 0x3f) != 0) || (0x43f < uVar10)) {
      abort();
    }
    uVar13 = uVar10 >> 6;
    bVar2 = uVar10 != 0;
    if (uVar10 == 0) {
LAB_00106ce6:
      iVar12 = (int)uVar13 + iVar11;
    }
    else {
      puVar14 = &local_438;
      if (local_438._4_4_ != type) {
        uVar10 = 0;
        puVar15 = &local_438;
        do {
          if (uVar13 - 1 == uVar10) {
            bVar2 = false;
            goto LAB_00106ce6;
          }
          puVar14 = puVar15 + 8;
          uVar10 = uVar10 + 1;
          pEVar1 = (Elf64_Word *)((long)puVar15 + 0x44);
          puVar15 = puVar14;
        } while (*pEVar1 != type);
        bVar2 = uVar10 < uVar13;
      }
      uVar3 = *puVar14;
      EVar4 = puVar14[1];
      EVar5 = puVar14[2];
      EVar6 = puVar14[3];
      EVar7 = puVar14[4];
      uVar8 = puVar14[5];
      EVar9 = puVar14[7];
      out->sh_addralign = puVar14[6];
      out->sh_entsize = EVar9;
      out->sh_size = EVar7;
      out->sh_link = (int)uVar8;
      out->sh_info = (int)((ulong)uVar8 >> 0x20);
      out->sh_addr = EVar5;
      out->sh_offset = EVar6;
      out->sh_name = (int)uVar3;
      out->sh_type = (int)((ulong)uVar3 >> 0x20);
      out->sh_flags = EVar4;
      iVar12 = iVar11;
    }
  } while (!bVar2);
  return iVar11 < iVar16;
}

Assistant:

static bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const off_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (int i = 0; i < sh_num;) {
    const ssize_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const ssize_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_headers_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (int j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}